

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_logging.c
# Opt level: O1

void oonf_log(oonf_log_severity severity,oonf_log_source source,char *file,int line,void *hexptr,
             size_t hexlen,char *format,...)

{
  list_entity *plVar1;
  char in_AL;
  int iVar2;
  int iVar3;
  char *s;
  list_entity *plVar4;
  ulong uVar5;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  oonf_log_parameters param;
  oonf_walltime_str tbuf;
  va_list ap;
  oonf_log_parameters local_140;
  oonf_walltime_str local_116;
  __va_list_tag local_108;
  undefined1 local_e8 [48];
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  uVar5 = (ulong)source;
  if (severity == LOG_SEVERITY_WARN) {
    _log_warnings[uVar5] = _log_warnings[uVar5] + 1;
    _log_warnings[0] = _log_warnings[0] + 1;
  }
  local_108.reg_save_area = local_e8;
  local_108.overflow_arg_area = &stack0x00000010;
  local_108.gp_offset = 0x30;
  local_108.fp_offset = 0x30;
  _logbuffer._len = 0;
  _logbuffer._error = false;
  memset(_logbuffer._buf,0,_logbuffer._total);
  s = oonf_log_get_walltime(&local_116);
  iVar2 = abuf_puts(&_logbuffer,s);
  iVar3 = abuf_appendf(&_logbuffer," %s(%s) %s %d: ",LOG_SEVERITY_NAMES[severity],
                       LOG_SOURCE_NAMES[uVar5],file,(ulong)(uint)line);
  abuf_vappendf(&_logbuffer,format,&local_108);
  if (hexptr == (void *)0x0) {
    if (_logbuffer._buf[_logbuffer._len - 1] == '\n') {
      _logbuffer._buf[_logbuffer._len - 1] = '\0';
    }
  }
  else {
    if (_logbuffer._buf[_logbuffer._len - 1] != '\n') {
      abuf_puts(&_logbuffer,"\n");
    }
    abuf_hexdump(&_logbuffer,"",hexptr,hexlen);
  }
  local_140.buffer = _logbuffer._buf;
  local_140.severity = severity;
  local_140.source = source;
  local_140.file = file;
  local_140.line = line;
  local_140.timeLength = iVar2;
  local_140.prefixLength = iVar3;
  if ((_handler_list.next == &_handler_list) && (_handler_list.prev == &_handler_list)) {
    oonf_log_stderr((oonf_log_handler_entry *)0x0,&local_140);
  }
  else if ((_handler_list.next)->prev != _handler_list.prev) {
    plVar4 = _handler_list.next;
    do {
      plVar1 = plVar4->next;
      if ((*(byte *)((long)&plVar4[9].prev + uVar5) & severity) != 0) {
        (*(code *)plVar4[1].next)(plVar4,&local_140);
      }
      plVar4 = plVar1;
    } while (plVar1->prev != _handler_list.prev);
  }
  return;
}

Assistant:

void
oonf_log(enum oonf_log_severity severity, enum oonf_log_source source, const char *file, int line,
  const void *hexptr, size_t hexlen, const char *format, ...) {
  struct oonf_log_handler_entry *h, *iterator;
  struct oonf_log_parameters param;
  struct oonf_walltime_str tbuf;
  char *last;
  va_list ap;
  int p1 = 0, p2 = 0;

  if (severity == LOG_SEVERITY_WARN) {
    /* count warnings */
    _log_warnings[source]++;
    _log_warnings[LOG_ALL]++;
  }

  va_start(ap, format);

  /* generate log string */
  abuf_clear(&_logbuffer);
  p1 = abuf_puts(&_logbuffer, oonf_log_get_walltime(&tbuf));
  p2 = abuf_appendf(&_logbuffer, " %s(%s) %s %d: ", LOG_SEVERITY_NAMES[severity], LOG_SOURCE_NAMES[source], file, line);
  abuf_vappendf(&_logbuffer, format, ap);

  last = &abuf_getptr(&_logbuffer)[abuf_getlen(&_logbuffer) - 1];
  if (hexptr) {
    /* append \n at the end of the line if necessary */
    if (*last != '\n') {
      abuf_puts(&_logbuffer, "\n");
    }

    abuf_hexdump(&_logbuffer, "", hexptr, hexlen);
  }
  else {
    /* remove \n at the end of the line if necessary */
    if (*last == '\n') {
      *last = 0;
    }
  }

  param.severity = severity;
  param.source = source;
  param.file = file;
  param.line = line;
  param.buffer = abuf_getptr(&_logbuffer);
  param.timeLength = p1;
  param.prefixLength = p2;

  /* use stderr logger if nothing has been configured */
  if (list_is_empty(&_handler_list)) {
    oonf_log_stderr(NULL, &param);
  }
  else {
    /* call all log handlers */
    list_for_each_element_safe(&_handler_list, h, _node, iterator) {
      if (oonf_log_mask_test(h->_processed_bitmask, source, severity)) {
        h->handler(h, &param);
      }
    }
  }
  va_end(ap);
}